

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_base_col_comp_const_operation<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
               (void)

{
  Column_support *pCVar1;
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  *this;
  uint uVar2;
  ulong uVar3;
  Column *pCVar4;
  node_ptr plVar5;
  pointer puVar6;
  char *pcVar7;
  size_type sVar8;
  undefined8 uVar9;
  Column_zp_settings *this_00;
  ulong uVar10;
  undefined4 uVar11;
  ulong uVar12;
  ulong uVar13;
  node_ptr plVar14;
  bool bVar15;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Column_settings settings;
  Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
  m;
  Delete_disposer local_1b0;
  anon_class_1_0_00000001 local_1a3;
  anon_class_1_0_00000001 local_1a2;
  anon_class_1_0_00000001 local_1a1;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  local_1a0;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_170;
  pair<unsigned_int,_unsigned_int> local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_140;
  Column_zp_settings local_130;
  anon_class_8_1_e4bd5e45 local_d8;
  undefined1 local_d0 [80];
  pointer local_80;
  pointer local_60;
  
  Gudhi::persistence_matrix::
  Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
  ::Column_zp_settings::Column_zp_settings(&local_130,5);
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            ();
  this_00 = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
  ::Column_zp_settings::Column_zp_settings(this_00,5);
  this = (Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
          *)(local_d0 + 8);
  local_d0._0_8_ = this_00;
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
  ::
  Base_matrix_with_column_compression<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
              *)this,&local_170,this_00);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&local_170,
             (Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
              *)local_d0);
  local_1a0.super_Row_access_option.columnIndex_ = 0;
  local_1a0.super_Row_access_option._4_4_ = 2;
  local_1a0.super_Row_access_option.rows_ = (Row_container *)0x400000001;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_170.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 6),&local_1a0);
  local_1a0.super_Row_access_option.columnIndex_ = 0;
  local_1a0.super_Row_access_option._4_4_ = 2;
  local_1a0.super_Row_access_option.rows_ = (Row_container *)0x400000001;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_170.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 10),&local_1a0);
  local_158.first = 0;
  local_158.second = 1;
  uStack_150 = 0x400000001;
  local_148 = 0x100000004;
  local_140._M_len = 3;
  local_140._M_array = &local_158;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
  ::Intrusive_list_column<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
              *)&local_1a0,&local_140,&local_130);
  uVar3 = local_80[10];
  uVar12 = uVar3;
  uVar13 = uVar3;
  if (uVar3 != 10) {
    do {
      uVar13 = local_80[uVar12];
      bVar15 = uVar13 != uVar12;
      uVar12 = uVar13;
    } while (bVar15);
  }
  if (uVar13 != uVar3) {
    uVar12 = 10;
    do {
      uVar10 = uVar3;
      local_80[uVar12] = uVar13;
      uVar3 = local_80[uVar10];
      uVar12 = uVar10;
    } while (uVar13 != local_80[uVar10]);
  }
  pCVar4 = local_60[uVar13 & 0xffffffff];
  boost::intrusive::
  bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
  ::
  erase<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column,std::less<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column>>
            ((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
              *)(local_d0 + 0x10),pCVar4);
  local_1b0.col_ = &pCVar4->super_Column;
  local_d8.targetColumn = &pCVar4->super_Column;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,fal___ss<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>::Matrix_column_tag,1u>,false>&)_1_>
            (&local_1a0,&pCVar4->super_Column,&local_1a1,(anon_class_8_1_e4bd5e45 *)&local_1b0,
             &local_d8,&local_1a2,&local_1a3);
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::_insert_column(this,(Index)uVar13);
  local_1b0.col_ = &local_1a0;
  if (local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
      (node_ptr)&local_1a0.column_) {
    do {
      plVar14 = (local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_)->
                next_;
      (local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_)->next_ =
           (node_ptr)0x0;
      (local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_)->prev_ =
           (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
      ::Delete_disposer::operator()
                (&local_1b0,
                 (Entry *)&local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.
                           next_[-2].prev_);
      local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = plVar14;
    } while (plVar14 != (node_ptr)&local_1a0.column_);
  }
  local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  test_content_equality<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&local_170,
             (Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
              *)local_d0);
  local_1a0.super_Row_access_option.columnIndex_ = 0;
  local_1a0.super_Row_access_option._4_4_ = 1;
  local_1a0.super_Row_access_option.rows_ = (Row_container *)0x200000001;
  local_1a0.operators_._0_4_ = 2;
  local_1a0.operators_._4_4_ = 2;
  local_1a0.entryPool_._0_4_ = 4;
  local_1a0.entryPool_._4_4_ = 1;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_170.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_1a0);
  pCVar1 = &local_1a0.column_;
  local_1a0.super_Row_access_option.columnIndex_ = 0;
  local_1a0.super_Row_access_option._4_4_ = 1;
  local_1a0.super_Row_access_option.rows_ = (Row_container *)0x200000001;
  local_1a0.operators_._0_4_ = 2;
  local_1a0.operators_._4_4_ = 2;
  local_1a0.entryPool_._0_4_ = 4;
  local_1a0.entryPool_._4_4_ = 1;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_170.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 8),&local_1a0,pCVar1);
  local_158.first = 0;
  local_158.second = 1;
  uStack_150 = 0x400000001;
  local_148 = 0x100000004;
  local_140._M_len = 3;
  local_140._M_array = &local_158;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
  ::Intrusive_list_column<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
              *)&local_1a0,&local_140,&local_130);
  uVar2 = ((Field_operators *)local_d0._0_8_)->characteristic_;
  uVar11 = 3;
  if ((int)uVar2 < 4) {
    uVar11 = (undefined4)(3 % (ulong)uVar2);
  }
  local_1b0.col_._0_4_ = uVar11;
  uVar3 = local_80[5];
  uVar12 = uVar3;
  uVar13 = uVar3;
  if (uVar3 != 5) {
    do {
      uVar13 = local_80[uVar12];
      bVar15 = uVar13 != uVar12;
      uVar12 = uVar13;
    } while (bVar15);
  }
  if (uVar13 != uVar3) {
    uVar12 = 5;
    do {
      uVar10 = uVar3;
      local_80[uVar12] = uVar13;
      uVar3 = local_80[uVar10];
      uVar12 = uVar10;
    } while (uVar13 != local_80[uVar10]);
  }
  pCVar4 = local_60[uVar13 & 0xffffffff];
  boost::intrusive::
  bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
  ::
  erase<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column,std::less<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column>>
            ((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
              *)(local_d0 + 0x10),pCVar4);
  Gudhi::persistence_matrix::
  _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            ((Field_element *)&local_1b0,&local_1a0,&pCVar4->super_Column);
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::_insert_column(this,(Index)uVar13);
  local_1b0.col_ = &local_1a0;
  if (local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
      (node_ptr)pCVar1) {
    plVar14 = local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
    do {
      plVar5 = plVar14->next_;
      plVar14->next_ = (node_ptr)0x0;
      plVar14->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
      ::Delete_disposer::operator()(&local_1b0,(Entry *)&plVar14[-2].prev_);
      plVar14 = plVar5;
    } while (plVar5 != (node_ptr)pCVar1);
  }
  local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  test_content_equality<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&local_170,
             (Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
              *)local_d0);
  local_1a0.super_Row_access_option.columnIndex_ = 1;
  local_1a0.super_Row_access_option._4_4_ = 1;
  local_1a0.super_Row_access_option.rows_ = (Row_container *)0x300000004;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_170.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 6),&local_1a0);
  local_1a0.super_Row_access_option.columnIndex_ = 1;
  local_1a0.super_Row_access_option._4_4_ = 1;
  local_1a0.super_Row_access_option.rows_ = (Row_container *)0x300000004;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_170.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 10),&local_1a0);
  local_158.first = 0;
  local_158.second = 1;
  uStack_150 = 0x400000001;
  local_148 = 0x100000004;
  local_140._M_len = 3;
  local_140._M_array = &local_158;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
  ::Intrusive_list_column<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
              *)&local_1a0,&local_140,&local_130);
  uVar2 = ((Field_operators *)local_d0._0_8_)->characteristic_;
  uVar11 = 3;
  if ((int)uVar2 < 4) {
    uVar11 = (undefined4)(3 % (ulong)uVar2);
  }
  local_1b0.col_._0_4_ = uVar11;
  uVar3 = local_80[6];
  uVar12 = uVar3;
  uVar13 = uVar3;
  if (uVar3 != 6) {
    do {
      uVar13 = local_80[uVar12];
      bVar15 = uVar13 != uVar12;
      uVar12 = uVar13;
    } while (bVar15);
  }
  if (uVar13 != uVar3) {
    uVar12 = 6;
    do {
      uVar10 = uVar3;
      local_80[uVar12] = uVar13;
      uVar3 = local_80[uVar10];
      uVar12 = uVar10;
    } while (uVar13 != local_80[uVar10]);
  }
  pCVar4 = local_60[uVar13 & 0xffffffff];
  boost::intrusive::
  bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
  ::
  erase<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column,std::less<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column>>
            ((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>::Column,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
              *)(local_d0 + 0x10),pCVar4);
  Gudhi::persistence_matrix::
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            ((Field_element *)&local_1b0,&local_1a0,&pCVar4->super_Column);
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::_insert_column(this,(Index)uVar13);
  local_1b0.col_ = &local_1a0;
  if (local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
      (node_ptr)pCVar1) {
    plVar14 = local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
    do {
      plVar5 = plVar14->next_;
      plVar14->next_ = (node_ptr)0x0;
      plVar14->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
      ::Delete_disposer::operator()(&local_1b0,(Entry *)&plVar14[-2].prev_);
      plVar14 = plVar5;
    } while (plVar5 != (node_ptr)pCVar1);
  }
  local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  local_1a0.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  test_content_equality<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&local_170,
             (Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
              *)local_d0);
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::reset(this,(Column_settings *)local_d0._0_8_);
  uVar9 = local_d0._0_8_;
  if ((Column_settings *)local_d0._0_8_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)(local_d0._0_8_ + 0x20));
    puVar6 = (((Field_operators *)uVar9)->inverse_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar6 != (pointer)0x0) {
      operator_delete(puVar6,(long)(((Field_operators *)uVar9)->inverse_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar6)
      ;
    }
    operator_delete((void *)uVar9,0x58);
  }
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::~Base_matrix_with_column_compression(this);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_170);
  if (local_130.entryConstructor.entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
      list.ptr != (char *)0x0) {
    do {
      pcVar7 = *(char **)(local_130.entryConstructor.entryPool_.
                          super_pool<boost::default_user_allocator_malloc_free>.list.ptr +
                         (local_130.entryConstructor.entryPool_.
                          super_pool<boost::default_user_allocator_malloc_free>.list.sz - 0x10));
      sVar8 = *(size_type *)
               (local_130.entryConstructor.entryPool_.
                super_pool<boost::default_user_allocator_malloc_free>.list.ptr +
               (local_130.entryConstructor.entryPool_.
                super_pool<boost::default_user_allocator_malloc_free>.list.sz - 8));
      free(local_130.entryConstructor.entryPool_.
           super_pool<boost::default_user_allocator_malloc_free>.list.ptr);
      local_130.entryConstructor.entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
      list.ptr = pcVar7;
      local_130.entryConstructor.entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
      list.sz = sVar8;
    } while (pcVar7 != (char *)0x0);
    local_130.entryConstructor.entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
    super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
    local_130.entryConstructor.entryPool_.super_pool<boost::default_user_allocator_malloc_free>.list
    .ptr = (char *)0x0;
    local_130.entryConstructor.entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
    next_size = local_130.entryConstructor.entryPool_.
                super_pool<boost::default_user_allocator_malloc_free>.start_size;
  }
  if (local_130.operators.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.operators.inverse_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_base_col_comp_const_operation() {
  using C = typename Matrix::Column;
  typename Matrix::Column_settings settings(5);

  auto columns = build_general_matrix<C>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[6] = {1};
    columns[10] = {1};
    m.add_to(C({0, 1, 4}, &settings), 10);  // only works with the const version because of reference
  } else {
    columns[6] = {{0, 2}, {1, 4}};
    columns[10] = {{0, 2}, {1, 4}};
    m.add_to(C({{0, 1}, {1, 4}, {4, 1}}, &settings), 10);
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {0, 2, 4};
    columns[8] = {0, 2, 4};
    m.multiply_target_and_add_to(C({0, 1, 4}, &settings), 3, 5);
  } else {
    columns[5] = {{0, 1}, {1, 2}, {2, 2}, {4, 1}};
    columns[8] = {{0, 1}, {1, 2}, {2, 2}, {4, 1}};
    m.multiply_target_and_add_to(C({{0, 1}, {1, 4}, {4, 1}}, &settings), 3, 5);
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[6] = {0, 4};
    columns[10] = {0, 4};
    m.multiply_source_and_add_to(3, C({0, 1, 4}, &settings), 6);
  } else {
    columns[6] = {{1, 1}, {4, 3}};
    columns[10] = {{1, 1}, {4, 3}};
    m.multiply_source_and_add_to(3, C({{0, 1}, {1, 4}, {4, 1}}, &settings), 6);
  }
  test_content_equality(columns, m);
}